

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O3

bool __thiscall
HDFHDD::Create(HDFHDD *this,string *path,uint64_t total_bytes_,IDENTIFYDEVICE *pIdentify_,
              bool fOverwrite_)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  RS_IDE sHeader;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined6 uStack_58;
  string local_48;
  
  bVar2 = false;
  iVar3 = open64((path->_M_dataplus)._M_p,(uint)!fOverwrite_ << 7 | 0x42,0x180);
  (this->super_HDD).h = iVar3;
  if (iVar3 != -1) {
    (this->super_HDD).sector_size = 0x200;
    (this->super_HDD).data_offset = 0;
    (this->super_HDD).total_bytes = total_bytes_;
    (this->super_HDD).total_sectors = total_bytes_ >> 9 & 0xffffffff;
    if ((pIdentify_ == (IDENTIFYDEVICE *)0x0) || (pIdentify_->len != 0x204)) {
      pIdentify_ = (IDENTIFYDEVICE *)0x0;
    }
    HDD::SetIdentifyData(&this->super_HDD,pIdentify_);
    local_68 = 0x492d5352;
    uStack_64 = 0x101a4544;
    uStack_60 = 0;
    uStack_5c = 0;
    uStack_5a = 0;
    uStack_58 = 0;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"hdf","");
    bVar2 = IsFileExt(path,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar1 = uStack_60;
    if (bVar2) {
      if (opt.hdf == 10) {
        (this->super_HDD).sIdentify.len = 0x6a;
        iVar3 = 0x80;
      }
      else {
        uStack_64 = CONCAT13(0x11,(undefined3)uStack_64);
        iVar3 = (this->super_HDD).sIdentify.len + 0x16;
      }
      (this->super_HDD).data_offset = iVar3;
      uStack_60._3_1_ = SUB41(uVar1,3);
      uStack_60._0_3_ =
           CONCAT12((char)((uint)iVar3 >> 8),CONCAT11((char)iVar3,(undefined1)uStack_60));
    }
    else {
      iVar3 = (this->super_HDD).data_offset;
    }
    bVar2 = true;
    if ((iVar3 != 0) &&
       ((sVar4 = write((this->super_HDD).h,&local_68,0x16), sVar4 != 0x16 ||
        (sVar4 = write((this->super_HDD).h,&(this->super_HDD).sIdentify.field_1,
                       (long)(this->super_HDD).sIdentify.len),
        sVar4 != (this->super_HDD).sIdentify.len)))) {
      close((this->super_HDD).h);
      (this->super_HDD).h = -1;
      unlink((path->_M_dataplus)._M_p);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool HDFHDD::Create(const std::string& path, uint64_t total_bytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_/*=false*/)
{
    bool fRet = true;

    if ((h = open(path.c_str(), O_CREAT | O_RDWR | O_SEQUENTIAL | O_BINARY | (fOverwrite_ ? 0 : O_EXCL), S_IREAD | S_IWRITE)) == -1)
        return false;

    // Set the new disk geometry
    data_offset = 0;
    sector_size = SECTOR_SIZE;
    total_bytes = total_bytes_;
    total_sectors = static_cast<unsigned>(total_bytes_ / sector_size);

    // Preserve the source identify data if it's complete, otherwise generate new
    if (pIdentify_ && pIdentify_->len == sizeof(*pIdentify_))
        SetIdentifyData(pIdentify_);
    else
        SetIdentifyData();

    // HDF v1.0 header
    RS_IDE sHeader = { {'R','S','-','I','D','E'}, 0x1a, 0x10, 0x00, 0,0, {} };

    // Are we creating an HDF image?
    if (IsFileExt(path, "hdf"))
    {
        // Are we forced to use HDF v1.0?
        if (opt.hdf == 10)
        {
            // v1.0 has a 128-byte limit for the header+identify data
            sIdentify.len = 128 - sizeof(RS_IDE);
        }
        else
        {
            // v1.1 preserves all identify data, and has a new version number
            sHeader.bRevision = 0x11;
        }

        // Complete the HDD data offset now it's known
        data_offset = sizeof(RS_IDE) + sIdentify.len;
        sHeader.bOffsetLow = data_offset & 0xff;
        sHeader.bOffsetHigh = static_cast<uint8_t>(data_offset >> 8);
    }

#ifdef _WIN32
    HANDLE hfile = reinterpret_cast<HANDLE>(_get_osfhandle(h));

    // Ensure there's space for the full file, then truncate and write just the header
    if (_lseeki64(h, total_bytes + data_offset, SEEK_SET) != static_cast<int64_t>(total_bytes + data_offset) ||
        !SetEndOfFile(hfile) ||
        _lseeki64(h, 0, SEEK_SET) != 0 ||
        !SetEndOfFile(hfile))
        fRet = false;
#endif

    // If this is an HDF image, write the header and identity data
    if (fRet && data_offset &&
        (write(h, &sHeader, sizeof(sHeader)) != sizeof(sHeader) ||
            write(h, sIdentify.byte, sIdentify.len) != static_cast<int>(sIdentify.len)))
        fRet = false;

    // If anything went wrong, delete the (possibly partial) file
    if (!fRet)
    {
        close(h);
        h = -1;

        unlink(path.c_str());
    }

    return fRet;
}